

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::LE_Detonation_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_Detonation_PDU *this)

{
  byte bVar1;
  ostream *poVar2;
  ulong uVar3;
  KINT32 Value;
  ushort uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  KStringStream ss;
  char local_381;
  KString local_380;
  KString local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  LE_Header::GetAsString_abi_cxx11_((KString *)local_340,&this->super_LE_Header);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"-LE Detonation PDU-\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Optional Field Flags:\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\tTarget ID:                            ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\tMunition ID:                          ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\tMunition Site & Application Included: ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\tEvent Site & Application Included:    ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\tWarhead & Fuse Included:              ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\tQuantity & Rate Included:             ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\tLocation In Entity Coordinates:       ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"\tFlag 2:                               ",0x27);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_340 + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != paVar5) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if ((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\tMunition Orientation: ",0x17);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\tEvent Number: ",0xf);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Target ID: ",0xb);
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_((KString *)local_340,&this->m_TargetID);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._0_8_ != paVar5) {
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
    }
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Munition ID: ",0xd);
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_((KString *)local_340,&this->m_MunitionID)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._0_8_ != paVar5) {
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
    }
  }
  bVar1 = (this->m_DetonationFlag1Union).m_ui8Flag;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 8) != 0 || ((this->m_DetonationFlag2Union).m_ui8Flag & 2) != 0) goto LAB_001457f2;
  }
  else if ((bVar1 & 8) != 0) {
LAB_001457f2:
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Event ID: ",10);
    DATA_TYPE::LE_EntityIdentifier::GetAsString_abi_cxx11_((KString *)local_340,&this->m_EventID);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._0_8_ != paVar5) {
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
    }
  }
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_((KString *)local_340,&this->m_MunitionDesc);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != paVar5) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (((this->m_DetonationFlag1Union).m_ui8Flag & 0x40) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Location(World Coordinates):\n",0x1d);
    DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_360,&this->m_LocWrldCoord);
    std::__cxx11::stringstream::stringstream((stringstream *)local_340);
    poVar2 = (ostream *)(local_340 + 0x10);
    local_381 = '\t';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_381,1);
    if (local_360._M_string_length != 0) {
      uVar4 = 1;
      uVar3 = 0;
      do {
        local_381 = local_360._M_dataplus._M_p[uVar3];
        if ((local_360._M_string_length - 1 == uVar3) || (local_381 != '\n')) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_381,1);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_381,1);
          local_381 = '\t';
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_381,1);
        }
        uVar3 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar3 < local_360._M_string_length);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_380._M_dataplus._M_p,local_380._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p == &local_360.field_2) goto LAB_00145a13;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Location(Entity Coordinates): ",0x1e);
    DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
              ((KString *)local_340,&this->m_LocEntCoord);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
    local_360.field_2._M_allocated_capacity = local_330[0]._M_allocated_capacity;
    local_360._M_dataplus._M_p = (pointer)local_340._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._0_8_ == paVar5) goto LAB_00145a13;
  }
  operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
LAB_00145a13:
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_340 + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Velocity: ",10);
  DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
            ((KString *)local_340,&this->m_Vel);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != paVar5) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (((char)(this->m_DetonationFlag1Union).m_ui8Flag < '\0') &&
     (((this->m_DetonationFlag2Union).m_ui8Flag & 1) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Munition Orienation: ",0x15);
    DATA_TYPE::LE_EulerAngles::GetAsString_abi_cxx11_((KString *)local_340,&this->m_Ori);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._0_8_ != paVar5) {
      operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
    }
  }
  DATA_TYPE::MunitionDescriptor::GetAsString_abi_cxx11_((KString *)local_340,&this->m_MunitionDesc);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
  DATA_TYPE::ENUMS::GetEnumAsStringDetonationResult_abi_cxx11_
            (&local_380,(ENUMS *)(ulong)this->m_ui8DetonationResult,Value);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_380._M_dataplus._M_p,local_380._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != paVar5) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

KString LE_Detonation_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-LE Detonation PDU-\n"
       << "Optional Field Flags:\n"
       << "\tTarget ID:                            " << ( KUINT16 )m_DetonationFlag1Union.m_ui8TargetId        << "\n"
       << "\tMunition ID:                          " << ( KUINT16 )m_DetonationFlag1Union.m_ui8MunitionId      << "\n"
       << "\tMunition Site & Application Included: " << ( KUINT16 )m_DetonationFlag1Union.m_ui8MunitionSiteApp << "\n"
       << "\tEvent Site & Application Included:    " << ( KUINT16 )m_DetonationFlag1Union.m_ui8EventSiteAppId  << "\n"
       << "\tWarhead & Fuse Included:              " << ( KUINT16 )m_DetonationFlag1Union.m_ui8WarheadFuse     << "\n"
       << "\tQuantity & Rate Included:             " << ( KUINT16 )m_DetonationFlag1Union.m_ui8QuantRate       << "\n"
       << "\tLocation In Entity Coordinates:       " << ( KUINT16 )m_DetonationFlag1Union.m_ui8LocationTyp     << "\n"
       << "\tFlag 2:                               " << ( KUINT16 )m_DetonationFlag1Union.m_ui8Flag2           << "\n";
    
    if (m_DetonationFlag1Union.m_ui8Flag2)
    {
        ss << "\tMunition Orientation: " << (KUINT16)m_DetonationFlag2Union.m_ui8MunitionOri << "\n"
           << "\tEvent Number: " << (KUINT16)m_DetonationFlag2Union.m_ui8EventNum            << "\n";
    }

    if( m_DetonationFlag1Union.m_ui8TargetId )
    {
        ss << "Target ID: " << m_TargetID.GetAsString();
    }

    if( m_DetonationFlag1Union.m_ui8MunitionId )
    {
        ss << "Munition ID: " << m_MunitionID.GetAsString();
    }

    if( ( m_DetonationFlag1Union.m_ui8Flag2 && m_DetonationFlag2Union.m_ui8EventNum ) || m_DetonationFlag1Union.m_ui8EventSiteAppId )
    {
        ss << "Event ID: " << m_EventID.GetAsString();
    }

    ss << m_MunitionDesc.GetAsString();

    if( m_DetonationFlag1Union.m_ui8LocationTyp )
    {
        ss << "Location(Entity Coordinates): " << m_LocEntCoord.GetAsString();
    }
    else
    {
        ss << "Location(World Coordinates):\n" << IndentString( m_LocWrldCoord.GetAsString(), 1 );
    }

    ss << "Velocity: " << m_Vel.GetAsString();

    if( m_DetonationFlag1Union.m_ui8Flag2 && m_DetonationFlag2Union.m_ui8MunitionOri )
    {
        ss << "Munition Orienation: " << m_Ori.GetAsString();
    }

    ss << m_MunitionDesc.GetAsString()
       << GetEnumAsStringDetonationResult( m_ui8DetonationResult )
       << "\n";

    return ss.str();
}